

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

void __thiscall
llvm::raw_fd_ostream::raw_fd_ostream
          (raw_fd_ostream *this,StringRef Filename,error_code *EC,FileAccess Access)

{
  int iVar1;
  error_category *peVar2;
  
  iVar1 = fileno(_stdout);
  *(undefined4 *)&this->field_0x20 = 1;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined ***)this = &PTR__raw_fd_ostream_00d78c90;
  this->FD = iVar1;
  this->ShouldClose = true;
  this->SupportsSeeking = false;
  this->ColorEnabled = true;
  (this->EC)._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  (this->EC)._M_cat = peVar2;
  this->pos = 0;
  return;
}

Assistant:

raw_fd_ostream::raw_fd_ostream(StringRef Filename, std::error_code &EC,
                               sys::fs::FileAccess Access)
    : raw_fd_ostream(Filename, EC, sys::fs::CD_CreateAlways, Access,
                     sys::fs::OF_None) {}